

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_cluster_listen_on_close(intptr_t uuid,fio_protocol_s *protocol)

{
  int iVar1;
  __pid_t _Var2;
  
  free(protocol);
  cluster_data.uuid = -1;
  iVar1 = fio_data->parent;
  _Var2 = getpid();
  if ((iVar1 == _Var2) && (fio_data->active != '\0')) {
    fio_data->active = '\0';
  }
  return;
}

Assistant:

static void fio_cluster_listen_on_close(intptr_t uuid,
                                        fio_protocol_s *protocol) {
  free(protocol);
  cluster_data.uuid = -1;
  if (fio_parent_pid() == getpid()) {
#if DEBUG
    FIO_LOG_DEBUG("(%d) stopped listening for cluster connections",
                  (int)getpid());
#endif
    if (fio_data->active)
      fio_stop();
  }
  (void)uuid;
}